

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c++
# Opt level: O0

void __thiscall
kj::TimerImpl::TimerPromiseAdapter::TimerPromiseAdapter
          (TimerPromiseAdapter *this,PromiseFulfiller<void> *fulfiller,TimerImpl *parent,
          TimePoint time)

{
  SleepHooks *pSVar1;
  bool bVar2;
  multiset<kj::TimerImpl::TimerPromiseAdapter_*,_kj::TimerImpl::Impl::TimerBefore,_std::allocator<kj::TimerImpl::TimerPromiseAdapter_*>_>
  *pmVar3;
  Maybe<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>_> local_60;
  _Self local_50;
  SleepHooks *local_48;
  SleepHooks *h;
  SleepHooks *_h47;
  _Base_ptr local_30;
  TimerImpl *local_28;
  TimerImpl *parent_local;
  PromiseFulfiller<void> *fulfiller_local;
  TimerPromiseAdapter *this_local;
  TimePoint time_local;
  
  (this->time).value.value = (long)time.value.value;
  this->fulfiller = fulfiller;
  this->parent = parent;
  local_28 = parent;
  parent_local = (TimerImpl *)fulfiller;
  fulfiller_local = (PromiseFulfiller<void> *)this;
  this_local = (TimerPromiseAdapter *)time.value.value;
  std::_Rb_tree_const_iterator<kj::TimerImpl::TimerPromiseAdapter_*>::_Rb_tree_const_iterator
            (&this->pos);
  pmVar3 = &Own<kj::TimerImpl::Impl,_std::nullptr_t>::operator->(&local_28->impl)->timers;
  _h47 = (SleepHooks *)this;
  local_30 = (_Base_ptr)
             std::
             multiset<kj::TimerImpl::TimerPromiseAdapter_*,_kj::TimerImpl::Impl::TimerBefore,_std::allocator<kj::TimerImpl::TimerPromiseAdapter_*>_>
             ::insert(pmVar3,(value_type *)&_h47);
  (this->pos)._M_node = local_30;
  local_48 = kj::_::readMaybe<kj::TimerImpl::SleepHooks>(&local_28->sleepHooks);
  if (local_48 != (SleepHooks *)0x0) {
    h = local_48;
    pmVar3 = &Own<kj::TimerImpl::Impl,_std::nullptr_t>::operator->(&local_28->impl)->timers;
    local_50._M_node =
         (_Base_ptr)
         std::
         multiset<kj::TimerImpl::TimerPromiseAdapter_*,_kj::TimerImpl::Impl::TimerBefore,_std::allocator<kj::TimerImpl::TimerPromiseAdapter_*>_>
         ::begin(pmVar3);
    bVar2 = std::operator==(&this->pos,&local_50);
    pSVar1 = local_48;
    if (bVar2) {
      Maybe<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>_>::Maybe
                (&local_60,
                 (Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel> *)
                 &this_local);
      (**pSVar1->_vptr_SleepHooks)(pSVar1,&local_60);
      Maybe<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>_>::~Maybe
                (&local_60);
    }
  }
  return;
}

Assistant:

TimerPromiseAdapter(PromiseFulfiller<void>& fulfiller, TimerImpl& parent, TimePoint time)
      : time(time), fulfiller(fulfiller), parent(parent) {
    pos = parent.impl->timers.insert(this);

    KJ_IF_SOME(h, parent.sleepHooks) {
      if (pos == parent.impl->timers.begin()) {
        h.updateNextTimerEvent(time);
      }
    }
  }